

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.h
# Opt level: O0

int GetAnalogInputOntrak(ONTRAK *pOntrak,int channel,int *pValue)

{
  int iVar1;
  size_t sVar2;
  uint8 local_b8 [4];
  int recvbuflen;
  char recvbuf [64];
  uint8 local_68 [4];
  int sendbuflen;
  char sendbuf [64];
  int *pValue_local;
  int channel_local;
  ONTRAK *pOntrak_local;
  
  sendbuf._56_8_ = pValue;
  memset(local_68,0,0x40);
  sprintf((char *)local_68,"0RD%d\r",(ulong)(uint)channel);
  sVar2 = strlen((char *)local_68);
  iVar1 = WriteDataOntrak(pOntrak,local_68,(int)sVar2,pOntrak->bytedelayus);
  if (iVar1 == 0) {
    if ((pOntrak->bSaveRawData != 0) && (pOntrak->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_68,(long)(int)sVar2,1,(FILE *)pOntrak->pfSaveFile);
      fflush((FILE *)pOntrak->pfSaveFile);
    }
    memset(local_b8,0,0x40);
    iVar1 = ReadAllRS232Port(&pOntrak->RS232Port,local_b8,5);
    if (iVar1 == 0) {
      if ((pOntrak->bSaveRawData != 0) && (pOntrak->pfSaveFile != (FILE *)0x0)) {
        fwrite(local_b8,5,1,(FILE *)pOntrak->pfSaveFile);
        fflush((FILE *)pOntrak->pfSaveFile);
      }
      iVar1 = __isoc99_sscanf(local_b8,"%d",sendbuf._56_8_);
      if (iVar1 == 1) {
        pOntrak_local._4_4_ = 0;
      }
      else {
        printf("Error reading data from a Ontrak : Invalid data. \n");
        pOntrak_local._4_4_ = 4;
      }
    }
    else {
      printf("Error reading data from a Ontrak. \n");
      pOntrak_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a Ontrak. \n");
    pOntrak_local._4_4_ = 1;
  }
  return pOntrak_local._4_4_;
}

Assistant:

inline int GetAnalogInputOntrak(ONTRAK* pOntrak, int channel, int* pValue)
{
	char sendbuf[MAX_NB_BYTES_ONTRAK];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ONTRAK];
	int recvbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "0RD%d\r", channel);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataOntrak(pOntrak, (unsigned char*)sendbuf, sendbuflen, pOntrak->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Ontrak. \n");
		return EXIT_FAILURE;
	}
	if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pOntrak->pfSaveFile);
		fflush(pOntrak->pfSaveFile);
	}

	// Prepare the buffer that should receive data from the device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 5; // The last character must be a 0 to be a valid string for sscanf.

	if (ReadAllRS232Port(&pOntrak->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Ontrak. \n");
		return EXIT_FAILURE;
	}
	if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pOntrak->pfSaveFile);
		fflush(pOntrak->pfSaveFile);
	}

	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);
	if (sscanf(recvbuf, "%d", pValue) != 1)
	{
		printf("Error reading data from a Ontrak : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	return EXIT_SUCCESS;
}